

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O2

attr_list INT_CMtest_transport(CMConnection conn,attr_list how)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  size_t sVar5;
  FFSEncodeVector full_vec;
  void *pvVar6;
  size_t sVar7;
  undefined4 *puVar8;
  FFSEncodeVector full_vec_00;
  FFSEncodeVector pFVar9;
  pthread_t pVar10;
  long lVar11;
  FFSEncodeVector pFVar12;
  CManager p_Var13;
  ulong uVar14;
  FILE *pFVar15;
  int j;
  long lVar16;
  ulong uVar17;
  int vecs;
  int repeat_count;
  CManager local_a8;
  int reuse_write_buffer;
  ssize_t size;
  int local_8c;
  attr_list result;
  FFSEncodeVector local_80;
  int local_74;
  int node_id;
  int verbose;
  int header [6];
  timespec ts;
  
  result = (attr_list)0x0;
  verbose = 0;
  vecs = 1;
  repeat_count = vecs;
  reuse_write_buffer = vecs;
  init_atoms();
  local_8c = INT_CMCondition_get(conn->cm,conn);
  local_a8 = conn->cm;
  iVar1 = get_long_attr(how,CM_TRANS_TEST_SIZE,&size);
  if (iVar1 == 0) {
    puts("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required");
    return (attr_list)0x0;
  }
  get_int_attr(how,CM_TRANS_TEST_VECS,&vecs);
  if (vecs < 1) {
    printf("Stupid vecs value in CMtest_transport, %d\n");
    return (attr_list)0x0;
  }
  if (((float)size / (float)vecs < 24.0) && (vecs = 1, size < 0x18)) {
    size = 0x18;
  }
  get_int_attr(how,CM_TRANS_TEST_VERBOSE,&verbose);
  get_int_attr(how,CM_TRANS_TEST_REPEAT,&repeat_count);
  get_int_attr(how,CM_TRANS_TEST_REUSE_WRITE_BUFFER,&reuse_write_buffer);
  get_int_attr(how,CM_TRANS_TEST_NODE,&node_id);
  pcVar4 = (char *)attr_list_to_string(how);
  sVar5 = strlen(pcVar4);
  lVar11 = (sVar5 << 0x20) + 0x1900000000;
  header[0] = 0x434d5000;
  header[1] = -0x6000000;
  if (lVar11 < 0) {
    header[1] = -0x5000001;
  }
  header[2] = (int)((ulong)lVar11 >> 0x20);
  header[3] = local_8c;
  header[4] = 0x18;
  header[5] = 0;
  INT_CMCondition_set_client_data(conn->cm,local_8c,&result);
  iVar1 = CMtrace_val[5];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(conn->cm,CMTransportVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar15 = (FILE *)conn->cm->CMTrace_file;
      _Var3 = getpid();
      pVar10 = pthread_self();
      fprintf(pFVar15,"P%lxT%lx - ",(long)_Var3,pVar10);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,
            "CM - Initiating transport test of %zd bytes, %d messages\n",size,
            (ulong)(uint)repeat_count);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  iVar1 = CMtrace_val[5];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(conn->cm,CMTransportVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar15 = (FILE *)conn->cm->CMTrace_file;
      _Var3 = getpid();
      pVar10 = pthread_self();
      fprintf(pFVar15,"P%lxT%lx - ",(long)_Var3,pVar10);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fwrite("CM - transport test, sending first message\n",0x2b,1,(FILE *)conn->cm->CMTrace_file);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  full_vec = (FFSEncodeVector)INT_CMmalloc((long)vecs * 0x10 + 0x10);
  full_vec->iov_base = header;
  full_vec->iov_len = 0x18;
  full_vec[1].iov_base = pcVar4;
  sVar5 = strlen(pcVar4);
  full_vec[1].iov_len = sVar5 + 1;
  iVar1 = INT_CMwrite_raw(conn,full_vec,(FFSEncodeVector)0x0,2,sVar5 + 0x19,(attr_list)0x0,1);
  free(pcVar4);
  pFVar9 = full_vec;
  if (iVar1 != 1) {
LAB_00125121:
    free(pFVar9);
    return (attr_list)0x0;
  }
  lVar11 = (size + vecs + -1) / (long)vecs;
  pFVar9 = (FFSEncodeVector)0x0;
  for (iVar1 = 0; iVar1 < repeat_count; iVar1 = iVar1 + 1) {
    if (pFVar9 == (FFSEncodeVector)0x0) {
      local_74 = iVar1;
      local_80 = (FFSEncodeVector)INT_CMmalloc((long)vecs * 0x10 + 0x20);
      iVar1 = vecs;
      local_80->iov_len = 0x14;
      uVar14 = (ulong)repeat_count;
      uVar17 = 0;
      if (0 < vecs) {
        uVar17 = (ulong)(uint)vecs;
      }
      for (lVar16 = 0; pFVar9 = local_80, uVar17 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
        pvVar6 = calloc(uVar14 + lVar11,1);
        *(void **)((long)&local_80[1].iov_base + lVar16) = pvVar6;
        *(long *)((long)&local_80[1].iov_len + lVar16) = lVar11;
      }
      for (lVar16 = 0; lVar16 < iVar1; lVar16 = lVar16 + 1) {
        for (uVar17 = 0; uVar17 < (ulong)((int)uVar14 + lVar11) >> 2; uVar17 = uVar17 + 1) {
          iVar1 = rand();
          *(int *)((long)pFVar9[lVar16 + 1].iov_base + uVar17 * 4) = iVar1;
          uVar14 = (ulong)(uint)repeat_count;
        }
        iVar1 = vecs;
      }
      sVar7 = local_80[1].iov_len - local_80->iov_len;
      if (local_80[1].iov_len < local_80->iov_len || sVar7 == 0) {
        sVar7 = 1;
      }
      local_80[1].iov_len = sVar7;
      pFVar9 = local_80;
      iVar1 = local_74;
    }
    puVar8 = (undefined4 *)INT_CMmalloc(0x14);
    pFVar9->iov_base = puVar8;
    *puVar8 = 0x434d5000;
    puVar8[1] = (uint)((ulong)size >> 0x20) & 0xffffff | 0xfb000000;
    puVar8[2] = (int)size;
    puVar8[3] = iVar1;
    puVar8[4] = node_id;
    lVar16 = (long)vecs;
    if (1 < lVar16) {
      pFVar9[lVar16].iov_len = size - (ulong)(vecs - 1) * lVar11;
    }
    full_vec_00 = (FFSEncodeVector)INT_CMmalloc(lVar16 * 0x10 + 0x20);
    memcpy(full_vec_00,pFVar9,(long)vecs * 0x10 + 0x20);
    pvVar6 = INT_CMmalloc(0x20);
    *(FFSEncodeVector *)((long)pvVar6 + 8) = full_vec_00;
    if ((iVar1 == repeat_count + -1) || (reuse_write_buffer == 0)) {
      *(int *)((long)pvVar6 + 0x10) = vecs;
      pFVar12 = pFVar9;
    }
    else {
      pFVar12 = (FFSEncodeVector)0x0;
    }
    *(FFSEncodeVector *)((long)pvVar6 + 0x18) = pFVar12;
    iVar2 = INT_CMwrite_raw_notify
                      (conn,full_vec_00,(FFSEncodeVector)0x0,(long)vecs + 1,size,(attr_list)0x0,0,
                       write_is_done,pvVar6);
    if (reuse_write_buffer == 0) {
      pFVar9 = (FFSEncodeVector)0x0;
    }
    if (iVar1 == repeat_count + -1) {
      pFVar9 = (FFSEncodeVector)0x0;
    }
    if (iVar2 != 1) goto LAB_00125121;
    if (conn->write_pending != 0) {
      wait_for_pending_write(conn);
    }
  }
  header[1] = -0x4000000;
  header[2] = 0x18;
  if (pFVar9 == (FFSEncodeVector)0x0) {
    pFVar9 = (FFSEncodeVector)INT_CMmalloc(0x10);
  }
  pFVar9->iov_base = header;
  pFVar9->iov_len = 0x18;
  iVar1 = INT_CMwrite_raw(conn,pFVar9,(FFSEncodeVector)0x0,1,0x18,(attr_list)0x0,0);
  free(pFVar9);
  free(full_vec);
  if (iVar1 != 1) {
    return (attr_list)0x0;
  }
  iVar1 = INT_CMCondition_wait(conn->cm,local_8c);
  p_Var13 = local_a8;
  if (iVar1 == 0) {
    iVar1 = CMtrace_val[5];
    if (local_a8->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(local_a8,CMTransportVerbose);
    }
    if (iVar1 == 0) goto LAB_001252ca;
    if (CMtrace_PID != 0) {
      pFVar15 = (FILE *)local_a8->CMTrace_file;
      _Var3 = getpid();
      pVar10 = pthread_self();
      p_Var13 = local_a8;
      fprintf(pFVar15,"P%lxT%lx - ",(long)_Var3,pVar10);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      p_Var13 = local_a8;
      fprintf((FILE *)local_a8->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar15 = (FILE *)p_Var13->CMTrace_file;
    pcVar4 = "CM - Completed transport test CONNECTION FAILED- result %p \n";
  }
  else {
    iVar1 = CMtrace_val[5];
    if (local_a8->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(local_a8,CMTransportVerbose);
    }
    if (iVar1 == 0) goto LAB_001252ca;
    if (CMtrace_PID != 0) {
      pFVar15 = (FILE *)local_a8->CMTrace_file;
      _Var3 = getpid();
      pVar10 = pthread_self();
      p_Var13 = local_a8;
      fprintf(pFVar15,"P%lxT%lx - ",(long)_Var3,pVar10);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      p_Var13 = local_a8;
      fprintf((FILE *)local_a8->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    pFVar15 = (FILE *)p_Var13->CMTrace_file;
    pcVar4 = "CM - Completed transport test - result %p \n";
  }
  fprintf(pFVar15,pcVar4,result);
LAB_001252ca:
  fflush((FILE *)p_Var13->CMTrace_file);
  return result;
}

Assistant:

extern attr_list
INT_CMtest_transport(CMConnection conn, attr_list how)
{
    int i;
    int cond;
    attr_list result = NULL;
    long actual;
    struct FFSEncodeVec *write_vec;
    struct FFSEncodeVec *tmp_vec, *header_vec;
    int header[6];
    ssize_t size;
    int vecs = 1;
    int verbose = 0;
    int repeat_count = 1;
    int reuse_write_buffer = 1;
    long start_size, count;
    init_atoms();
    cond = INT_CMCondition_get(conn->cm, conn);
    CManager cm = conn->cm;
    struct _free_struct *write_data;
    int node_id;

    if (!get_long_attr(how, CM_TRANS_TEST_SIZE, &size)) {
	printf("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required\n");
	return 0;
    }
    get_int_attr(how, CM_TRANS_TEST_VECS, &vecs);
    if (vecs < 1) {
	printf("Stupid vecs value in CMtest_transport, %d\n", vecs);
	return 0;
    }
    if (((float)size / (float) vecs) < 24.0) {
      vecs = 1;
      if (size < 24) {
	size = 24;
      }
    }
    get_int_attr(how, CM_TRANS_TEST_VERBOSE, &verbose);
    get_int_attr(how, CM_TRANS_TEST_REPEAT, &repeat_count);
    get_int_attr(how, CM_TRANS_TEST_REUSE_WRITE_BUFFER, &reuse_write_buffer);
    get_int_attr(how, CM_TRANS_TEST_NODE, &node_id);
    char *attr_str = attr_list_to_string(how);

    
    start_size = (int)strlen(attr_str) + (int)sizeof(header) + 1;
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)header)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)header)[1] = (CMPerfTestInit<<24);
#else
    ((int*)header)[1] = ((start_size >> 32) &0xffffff) | (CMPerfTestInit<<24);
#endif
    ((int*)header)[2] = (start_size & 0xffffffff);
    ((int*)header)[3] = cond;   /* condition value in third entry */
    ((int*)header)[4] = sizeof(header);   /* header size 4th entry */
    ((int*)header)[5] = 0;
    INT_CMCondition_set_client_data( conn->cm, cond, &result);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating transport test of %zd bytes, %d messages\n", size, repeat_count);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - transport test, sending first message\n");

    header_vec = malloc(sizeof(header_vec[0]) * (vecs + 1));  /* at least 2 */
    header_vec[0].iov_base = &header[0];
    header_vec[0].iov_len = sizeof(header);
    header_vec[1].iov_base = attr_str;
    header_vec[1].iov_len = strlen(attr_str) + 1; /* send NULL */
    actual = INT_CMwrite_raw(conn, header_vec, NULL, 2, header_vec[0].iov_len + header_vec[1].iov_len, NULL, 1);
    free(attr_str);
    if (actual != 1) { 
	free(header_vec);
	return NULL;
    }

    tmp_vec = NULL;
    size_t each = (size + vecs - 1) / vecs;
    for (i=0; i <repeat_count; i++) {
	if (tmp_vec == NULL) {
	    tmp_vec = malloc(sizeof(tmp_vec[0]) * (vecs + 2));  /* at least 2 */
	    tmp_vec[0].iov_len = 5 * sizeof(int); /* body header */
	    for (count = 0; count < vecs; count++) {
		tmp_vec[count+1].iov_base = calloc(each + repeat_count, 1);
		tmp_vec[count+1].iov_len = each;
	    }
	    for (count = 0; count < vecs; count++) {
		/* for each vector, give it unique data */
		int j;
		for (j=0; j < ((each + repeat_count) /sizeof(int)); j++) {
		    ((int*)tmp_vec[count+1].iov_base)[j] = rand();
		}
	    }
	    if (tmp_vec[1].iov_len > tmp_vec[0].iov_len) {
	      tmp_vec[1].iov_len -= tmp_vec[0].iov_len;
	    } else {
	      tmp_vec[1].iov_len = 1;  /* just so there's something */
	    }
	}
	tmp_vec[0].iov_base = malloc(5 * sizeof(int)); /* body header */
	((int*)tmp_vec[0].iov_base)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
	((int*)tmp_vec[0].iov_base)[1] = (CMPerfTestBody<<24);
#else
	((int*)tmp_vec[0].iov_base)[1] = ((size >> 32) &0xffffff) | (CMPerfTestBody<<24);
#endif
	((int*)tmp_vec[0].iov_base)[2] = (size & 0xffffffff);
	((int*)tmp_vec[0].iov_base)[3] = i;   /* sequence number */
	((int*)tmp_vec[0].iov_base)[4] = node_id;   /* node_id */
	if (vecs > 1) {
	    /* if more than one vec, handle rounding */
	    tmp_vec[vecs].iov_len = size - (each * (vecs-1));
	}
	write_vec = malloc(sizeof(write_vec[0]) * (vecs + 2));  /* at least 3 */
	memcpy(write_vec, tmp_vec, sizeof(write_vec[0]) * (vecs + 2));
	for (count = 0; count < vecs; count++) {
	    /* On each iteration, increment the write base for each buffer by 1 */
//	    write_vec[count+1].iov_base += i;
	}
	write_data = malloc(sizeof(struct _free_struct));
	write_data->write_vec = write_vec;
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    write_data->tmp_vec = tmp_vec;
	    write_data->vecs = vecs;
	} else {
	    write_data->tmp_vec = NULL;
	}
	actual = INT_CMwrite_raw_notify(conn, write_vec, NULL, vecs+1, size, 
					NULL, 0, write_is_done, (void*)write_data);
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    tmp_vec = NULL;
	}

	if (actual != 1) {
	    free(tmp_vec);
	    return NULL;
	}
	if (conn->write_pending) {
	    wait_for_pending_write(conn);
	}
    }
    ((int*)header)[1] = 0 | (CMPerfTestEnd<<24);
    ((int*)header)[2] = sizeof(header);
    if (!tmp_vec) tmp_vec = malloc(sizeof(tmp_vec[0]));
    tmp_vec[0].iov_base = &header[0];
    tmp_vec[0].iov_len = sizeof(header);
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, sizeof(header), NULL, 0);
    free(tmp_vec);
    free(header_vec);
    if (actual != 1) {
	return NULL;
    }

    int ret = INT_CMCondition_wait(conn->cm, cond);
    if (ret) {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test - result %p \n", result);
    } else {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test CONNECTION FAILED- result %p \n", result);
    }
    return result;
}